

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

value_t __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
::compute_diameter(Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
                   *this,simplex_t index,dimension_t dim)

{
  vertex_t i_00;
  char cVar1;
  pointer piVar2;
  uint uVar3;
  reference pvVar4;
  float *pfVar5;
  value_t local_38;
  char local_32;
  char local_31;
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>
  local_30 [6];
  dimension_t j;
  dimension_t i;
  undefined1 local_28 [8];
  float local_20;
  char local_19;
  value_t diam;
  dimension_t dim_local;
  simplex_t index_local;
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
  *this_local;
  
  local_19 = dim;
  _diam = (pointer)index;
  index_local = (simplex_t)this;
  local_20 = std::numeric_limits<float>::infinity();
  local_20 = -local_20;
  std::vector<int,_std::allocator<int>_>::resize(&this->vertices,(long)(local_19 + 1));
  piVar2 = _diam;
  cVar1 = local_19;
  uVar3 = Sparse_distance_matrix<Params>::size(&this->dist);
  std::vector<int,_std::allocator<int>_>::rbegin((vector<int,_std::allocator<int>_> *)local_28);
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>
  ::
  get_simplex_vertices<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
            (local_30,(simplex_t)this,(dimension_t)piVar2,(int)cVar1,
             (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
              *)(ulong)uVar3);
  for (local_31 = '\0'; local_31 <= local_19; local_31 = local_31 + '\x01') {
    for (local_32 = '\0'; local_32 < local_31; local_32 = local_32 + '\x01') {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->vertices,(long)local_31);
      i_00 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->vertices,(long)local_32);
      local_38 = Sparse_distance_matrix<Params>::operator()(&this->dist,i_00,*pvVar4);
      pfVar5 = std::max<float>(&local_20,&local_38);
      local_20 = *pfVar5;
    }
  }
  return local_20;
}

Assistant:

value_t compute_diameter(const simplex_t index, const dimension_t dim) const {
    value_t diam = -std::numeric_limits<value_t>::infinity();

    vertices.resize(dim + 1);
    get_simplex_vertices(index, dim, dist.size(), vertices.rbegin());

    for (dimension_t i = 0; i <= dim; ++i)
      for (dimension_t j = 0; j < i; ++j) {
        diam = std::max(diam, dist(vertices[i], vertices[j]));
      }
    return diam;
  }